

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O3

void __thiscall gl3cts::SparseBuffersWithCopyOpsTest::deinit(SparseBuffersWithCopyOpsTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_bo_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_bo_id);
    this->m_bo_id = 0;
  }
  if (this->m_bo_read_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_bo_read_id);
    this->m_bo_read_id = 0;
  }
  if (this->m_clear_buffer != (uchar *)0x0) {
    operator_delete__(this->m_clear_buffer);
    this->m_clear_buffer = (uchar *)0x0;
  }
  return;
}

Assistant:

void SparseBuffersWithCopyOpsTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_bo_read_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_read_id);

		m_bo_read_id = 0;
	}

	if (m_clear_buffer != DE_NULL)
	{
		delete[] m_clear_buffer;

		m_clear_buffer = DE_NULL;
	}
}